

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensurePlainTextEdit(QInputDialogPrivate *this)

{
  QPlainTextEdit *this_00;
  QWidgetPrivate *pQVar1;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  Function in_stack_00000020;
  offset_in_QPlainTextEdit_to_subr in_stack_00000030;
  QInputDialog *q;
  LineWrapMode in_stack_ffffffffffffffac;
  QPlainTextEdit *in_stack_ffffffffffffffc0;
  ConnectionType in_stack_fffffffffffffff4;
  Object *receiverPrivate;
  
  receiverPrivate = *(Object **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->plainTextEdit == (QPlainTextEdit *)0x0) {
    this_00 = (QPlainTextEdit *)operator_new(0x28);
    QPlainTextEdit::QPlainTextEdit(in_stack_ffffffffffffffc0,(QWidget *)in_RDI);
    in_RDI->plainTextEdit = this_00;
    QPlainTextEdit::setLineWrapMode(this_00,in_stack_ffffffffffffffac);
    pQVar1 = qt_widget_private((QWidget *)0x79adc1);
    pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
    QWidget::hide((QWidget *)0x79ade4);
    QObjectPrivate::connect<void(QPlainTextEdit::*)(),void(QInputDialogPrivate::*)()>
              (unaff_retaddr,in_stack_00000030,receiverPrivate,in_stack_00000020,
               in_stack_fffffffffffffff4);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  }
  if (*(Object **)(in_FS_OFFSET + 0x28) == receiverPrivate) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensurePlainTextEdit()
{
    Q_Q(QInputDialog);
    if (!plainTextEdit) {
        plainTextEdit = new QPlainTextEdit(q);
        plainTextEdit->setLineWrapMode(QPlainTextEdit::NoWrap);
#ifndef QT_NO_IM
        qt_widget_private(plainTextEdit)->inheritsInputMethodHints = 1;
#endif
        plainTextEdit->hide();
        QObjectPrivate::connect(plainTextEdit, &QPlainTextEdit::textChanged,
                                this, &QInputDialogPrivate::plainTextEditTextChanged);
    }
}